

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::LowerPrologEpilog(Lowerer *this)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  JITTimeFunctionBody *this_00;
  
  pIVar1 = this->m_func->m_headInstr;
  if (pIVar1->m_kind != InstrKindEntry) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1557,"(instr->IsEntryInstr())","First instr isn\'t an EntryInstr...");
    if (!bVar3) goto LAB_005cdbb6;
    *puVar4 = 0;
  }
  if (pIVar1->m_kind != InstrKindEntry) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x26,"(this->IsEntryInstr())","Bad call to AsEntryInstr()");
    if (!bVar3) goto LAB_005cdbb6;
    *puVar4 = 0;
  }
  LowererMD::LowerEntryInstr(&this->m_lowererMD,(EntryInstr *)pIVar1);
  pIVar1 = this->m_func->m_exitInstr;
  if (pIVar1->m_kind != InstrKindExit) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x155c,"(instr->IsExitInstr())","Last instr isn\'t an ExitInstr...");
    if (!bVar3) goto LAB_005cdbb6;
    *puVar4 = 0;
  }
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar3 = JITTimeFunctionBody::IsCoroutine(this_00);
  if (bVar3) {
    bVar3 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
    if (!bVar3) {
      LowerGeneratorHelper::EnsureEpilogueLabels(&this->m_lowerGeneratorHelper);
      LowerGeneratorHelper::InsertNullOutGeneratorFrameInEpilogue
                (&this->m_lowerGeneratorHelper,
                 (this->m_lowerGeneratorHelper).epilogueForReturnStatements);
    }
  }
  if (pIVar1->m_kind != InstrKindExit) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x42,"(this->IsExitInstr())","Bad call to AsExitInstr()");
    if (!bVar3) {
LAB_005cdbb6:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  LowererMD::LowerExitInstr(&this->m_lowererMD,(ExitInstr *)pIVar1);
  return;
}

Assistant:

void
Lowerer::LowerPrologEpilog()
{
    IR::Instr * instr;

    instr = m_func->m_headInstr;
    AssertMsg(instr->IsEntryInstr(), "First instr isn't an EntryInstr...");

    m_lowererMD.LowerEntryInstr(instr->AsEntryInstr());

    instr = m_func->m_exitInstr;
    AssertMsg(instr->IsExitInstr(), "Last instr isn't an ExitInstr...");

    if (m_func->GetJITFunctionBody()->IsCoroutine() && !m_func->IsLoopBody())
    {
        IR::LabelInstr* epilogueLabel = this->m_lowerGeneratorHelper.GetEpilogueForReturnStatements();
        this->m_lowerGeneratorHelper.InsertNullOutGeneratorFrameInEpilogue(epilogueLabel);
    }

    m_lowererMD.LowerExitInstr(instr->AsExitInstr());
}